

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_do(Curl_easy *data,_Bool *done)

{
  Curl_llist *list;
  void **ppvVar1;
  _Bool connected;
  connectdata *pcVar2;
  undefined8 *puVar3;
  FILEPROTO *pFVar4;
  wildcard_dtor p_Var5;
  connectdata *pcVar6;
  connectdata *pcVar7;
  CURLcode CVar8;
  wildcard_states wVar9;
  char *pcVar10;
  long lVar11;
  char *pcVar12;
  ftp_parselist_data **parserp;
  ftp_parselist_data *pfVar13;
  
  pcVar2 = data->conn;
  *done = false;
  (pcVar2->proto).ftpc.wait_data_conn = false;
  if (((data->state).field_0x6d0 & 0x40) == 0) {
    CVar8 = ftp_parse_url_path(data);
joined_r0x00548400:
    if (CVar8 == CURLE_OK) {
LAB_00548406:
      pcVar2 = data->conn;
      (data->req).size = -1;
      Curl_pgrsSetUploadCounter(data,0);
      Curl_pgrsSetDownloadCounter(data,0);
      Curl_pgrsSetUploadSize(data,-1);
      Curl_pgrsSetDownloadSize(data,-1);
      (pcVar2->proto).ftpc.ctl_valid = true;
      pcVar6 = data->conn;
      if (((data->set).field_0x8e5 & 2) != 0) {
        ((data->req).p.file)->fd = 1;
      }
      *done = false;
      CVar8 = ftp_state_quote(data,true,FTP_QUOTE);
      if (CVar8 == CURLE_OK) {
        pcVar7 = data->conn;
        CVar8 = Curl_pp_statemach(data,&(pcVar7->proto).ftpc.pp,false,false);
        *done = (pcVar7->proto).ftpc.state == FTP_STOP;
        connected = (pcVar6->bits).tcpconnect[1];
        Curl_infof(data,"ftp_perform ends with SECONDARY: %d",(ulong)connected);
        if (CVar8 == CURLE_OK) {
          if (*done != true) {
            return CURLE_OK;
          }
          CVar8 = ftp_dophase_done(data,connected);
          return CVar8;
        }
      }
      freedirs(&(pcVar2->proto).ftpc);
    }
    return CVar8;
  }
  list = &(data->wildcard).filelist;
  ppvVar1 = &(data->wildcard).protdata;
LAB_00548069:
  wVar9 = (data->wildcard).state;
  while (wVar9 == CURLWC_SKIP) {
    if ((data->set).chunk_end != (curl_chunk_end_callback)0x0) {
      Curl_set_in_callback(data,true);
      (*(data->set).chunk_end)((data->wildcard).customptr);
      Curl_set_in_callback(data,false);
    }
    Curl_llist_remove(list,(data->wildcard).filelist.head,(void *)0x0);
    wVar9 = ((data->wildcard).filelist.size == 0) + CURLWC_DOWNLOADING;
    (data->wildcard).state = wVar9;
  }
  switch(wVar9) {
  case CURLWC_CLEAR:
  case CURLWC_ERROR:
  case CURLWC_DONE:
    p_Var5 = (data->wildcard).dtor;
    CVar8 = CURLE_OK;
    if (p_Var5 != (wildcard_dtor)0x0) {
      (*p_Var5)(*ppvVar1);
      CVar8 = CURLE_OK;
    }
    break;
  case CURLWC_INIT:
    pFVar4 = (data->req).p.file;
    pcVar10 = pFVar4->path;
    pcVar12 = strrchr(pcVar10,0x2f);
    if (pcVar12 == (char *)0x0) {
      if (*pcVar10 != '\0') {
        pcVar12 = (*Curl_cstrdup)(pcVar10);
        (data->wildcard).pattern = pcVar12;
        goto LAB_005482eb;
      }
LAB_00548379:
      (data->wildcard).state = CURLWC_CLEAN;
      CVar8 = ftp_parse_url_path(data);
    }
    else {
      if (pcVar12[1] == '\0') goto LAB_00548379;
      pcVar10 = pcVar12 + 1;
      pcVar12 = (*Curl_cstrdup)(pcVar10);
      (data->wildcard).pattern = pcVar12;
LAB_005482eb:
      if (pcVar12 == (char *)0x0) {
        CVar8 = CURLE_OUT_OF_MEMORY;
      }
      else {
        *pcVar10 = '\0';
        parserp = (ftp_parselist_data **)(*Curl_ccalloc)(1,0x18);
        if (parserp == (ftp_parselist_data **)0x0) {
          CVar8 = CURLE_OUT_OF_MEMORY;
        }
        else {
          pfVar13 = Curl_ftp_parselist_data_alloc();
          *parserp = pfVar13;
          CVar8 = CURLE_OUT_OF_MEMORY;
          if (pfVar13 != (ftp_parselist_data *)0x0) {
            (data->wildcard).protdata = parserp;
            (data->wildcard).dtor = wc_data_dtor;
            if ((data->set).ftp_filemethod == '\x02') {
              (data->set).ftp_filemethod = '\x01';
            }
            CVar8 = ftp_parse_url_path(data);
            if (CVar8 == CURLE_OK) {
              pcVar10 = (*Curl_cstrdup)(pFVar4->path);
              (data->wildcard).path = pcVar10;
              CVar8 = CURLE_OUT_OF_MEMORY;
              if (pcVar10 != (char *)0x0) {
                parserp[1] = (ftp_parselist_data *)(data->set).fwrite_func;
                (data->set).fwrite_func = Curl_ftp_parselist;
                parserp[2] = (ftp_parselist_data *)(data->set).out;
                (data->set).out = data;
                CVar8 = CURLE_OK;
                Curl_infof(data,"Wildcard - Parsing started");
                goto LAB_005483cb;
              }
            }
          }
          Curl_ftp_parselist_data_free(parserp);
          (*Curl_cfree)(parserp);
        }
        (*Curl_cfree)((data->wildcard).pattern);
        (data->wildcard).pattern = (char *)0x0;
        *ppvVar1 = (void *)0x0;
        (data->wildcard).dtor = (wildcard_dtor)0x0;
      }
    }
LAB_005483cb:
    if ((data->wildcard).state != CURLWC_CLEAN) {
      wVar9 = (uint)(CVar8 != CURLE_OK) * 4 + CURLWC_MATCHING;
      goto LAB_005483e6;
    }
    goto joined_r0x00548400;
  case CURLWC_MATCHING:
    puVar3 = (undefined8 *)(data->wildcard).protdata;
    (data->set).fwrite_func = (curl_write_callback)puVar3[1];
    (data->set).out = (void *)puVar3[2];
    puVar3[1] = 0;
    puVar3[2] = 0;
    (data->wildcard).state = CURLWC_DOWNLOADING;
    CVar8 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar3);
    wVar9 = CURLWC_CLEAN;
    if (CVar8 == CURLE_OK) {
      if ((data->wildcard).filelist.size == 0) {
        (data->wildcard).state = CURLWC_CLEAN;
        return CURLE_REMOTE_FILE_NOT_FOUND;
      }
    }
    else {
LAB_0054822f:
      (data->wildcard).state = wVar9;
    }
    goto LAB_00548069;
  case CURLWC_DOWNLOADING:
    puVar3 = (undefined8 *)((data->wildcard).filelist.head)->ptr;
    pFVar4 = (data->req).p.file;
    pcVar10 = curl_maprintf("%s%s",(data->wildcard).path,*puVar3);
    if (pcVar10 == (char *)0x0) {
      CVar8 = CURLE_OUT_OF_MEMORY;
    }
    else {
      (*Curl_cfree)(pFVar4->freepath);
      pFVar4->path = pcVar10;
      pFVar4->freepath = pcVar10;
      Curl_infof(data,"Wildcard - START of \"%s\"",*puVar3);
      if ((data->set).chunk_bgn != (curl_chunk_bgn_callback)0x0) {
        Curl_set_in_callback(data,true);
        lVar11 = (*(data->set).chunk_bgn)
                           (puVar3,(data->wildcard).customptr,(int)(data->wildcard).filelist.size);
        Curl_set_in_callback(data,false);
        if (lVar11 == 2) {
          Curl_infof(data,"Wildcard - \"%s\" skipped by user",*puVar3);
          wVar9 = CURLWC_SKIP;
          goto LAB_0054822f;
        }
        if (lVar11 == 1) {
          CVar8 = CURLE_CHUNK_FAILED;
          break;
        }
      }
      wVar9 = CURLWC_SKIP;
      if (*(int *)(puVar3 + 1) != 0) goto LAB_0054822f;
      if ((*(byte *)(puVar3 + 0xc) & 0x40) != 0) {
        (pcVar2->proto).ftpc.known_filesize = puVar3[5];
      }
      CVar8 = ftp_parse_url_path(data);
      if (CVar8 == CURLE_OK) {
        CVar8 = CURLE_OK;
        Curl_llist_remove(list,(data->wildcard).filelist.head,(void *)0x0);
        if ((data->wildcard).filelist.size == 0) {
          (data->wildcard).state = CURLWC_CLEAN;
          goto LAB_00548406;
        }
      }
    }
    break;
  case CURLWC_CLEAN:
    if ((undefined8 *)*ppvVar1 == (undefined8 *)0x0) {
      wVar9 = CURLWC_DONE;
      CVar8 = CURLE_OK;
    }
    else {
      CVar8 = Curl_ftp_parselist_geterror(**ppvVar1);
      wVar9 = (CVar8 == CURLE_OK) + CURLWC_ERROR;
    }
LAB_005483e6:
    (data->wildcard).state = wVar9;
    goto LAB_005483ec;
  default:
    goto switchD_005480dd_caseD_5;
  }
  wVar9 = (data->wildcard).state;
LAB_005483ec:
  if ((wVar9 | CURLWC_MATCHING) == CURLWC_DONE) {
    return CURLE_OK;
  }
  goto joined_r0x00548400;
switchD_005480dd_caseD_5:
  do {
  } while( true );
}

Assistant:

static CURLcode ftp_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

  if(data->state.wildcardmatch) {
    result = wc_statemach(data);
    if(data->wildcard.state == CURLWC_SKIP ||
      data->wildcard.state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(data);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(data, done);

  return result;
}